

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void testGFMath(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Field *pFVar5;
  ostream *poVar6;
  ulong uVar7;
  initializer_list<int> __l;
  Element E;
  Element F;
  Element A;
  Element B;
  Element D;
  Element G;
  Element C;
  Element H;
  vector<int,_std::allocator<int>_> gfs;
  Field gf;
  Element local_3e8;
  Element local_3d8;
  Element local_3c8;
  Element local_3b8;
  Element local_3a8;
  Element local_398;
  Element local_388;
  Element local_378;
  Element local_368;
  Element local_358;
  Element local_348;
  Element local_338;
  Element local_328;
  Element local_318;
  Element local_308;
  Element local_2f8;
  Element local_2e8;
  string local_2d8;
  ulong local_2b8;
  vector<int,_std::allocator<int>_> local_2b0;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  Element local_118;
  Element local_108;
  Element local_f8;
  Field local_e8;
  
  puts("\tTesting Galois field arithmetic...");
  local_e8.n = 9;
  local_e8.p = 0xb;
  local_e8.q = 0xd;
  local_e8._12_4_ = 0x10;
  local_e8.inv.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0x31;
  __l._M_len = 5;
  __l._M_array = &local_e8.n;
  std::vector<int,_std::allocator<int>_>::vector(&local_2b0,__l,(allocator_type *)&local_2e8);
  if (local_2b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_2b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar7 = 0;
    do {
      local_2b8 = uVar7;
      Galois::Field::Field
                (&local_e8,
                 local_2b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar7]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Testing GF(",0xb);
      poVar6 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          local_2b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[local_2b8]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      Galois::Element::Element(&local_3d8,&local_e8,0);
      Galois::Element::Element(&local_3c8,&local_e8,0);
      Galois::Element::Element(&local_378,&local_e8,0);
      Galois::Element::Element(&local_348,&local_e8,0);
      Galois::Element::Element(&local_3b8,&local_e8,1);
      Galois::Element::Element(&local_398,&local_e8,2);
      Galois::Element::Element(&local_368,&local_e8,3);
      Galois::Element::Element(&local_388,&local_e8,6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"A: ",3);
      std::ostream::operator<<((ostream *)&std::cout,local_3b8.m_value);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"B: ",3);
      std::ostream::operator<<((ostream *)&std::cout,local_398.m_value);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"C: ",3);
      std::ostream::operator<<((ostream *)&std::cout,local_368.m_value);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"D: ",3);
      std::ostream::operator<<((ostream *)&std::cout,local_388.m_value);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: E = A + B\n",0x13);
      Galois::Element::Element
                (&local_3e8,local_3b8.m_gf,
                 ((local_3b8.m_gf)->plus).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_3b8.m_gf)->plus).m_sizeX * (long)local_398.m_value +
                  (long)local_3b8.m_value]);
      local_3d8.m_gf = local_3e8.m_gf;
      local_3d8.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: E = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_3d8.m_value);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: E = -A\n",0x10);
      Galois::Element::Element
                (&local_3e8,local_3b8.m_gf,
                 ((local_3b8.m_gf)->neg).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[local_3b8.m_value]);
      local_3d8.m_gf = local_3e8.m_gf;
      local_3d8.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: E = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_3d8.m_value);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: F = -E\n",0x10);
      Galois::Element::Element
                (&local_3e8,local_3d8.m_gf,
                 ((local_3d8.m_gf)->neg).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[local_3d8.m_value]);
      local_3c8.m_gf = local_3e8.m_gf;
      local_3c8.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: F = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_3c8.m_value);
      iVar4 = local_3b8.m_value;
      iVar3 = local_3c8.m_value;
      iVar1 = (local_3c8.m_gf)->q;
      iVar2 = (local_3b8.m_gf)->q;
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"ERROR: F==A is false","");
      Assert(iVar3 == iVar4 && iVar1 == iVar2,&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nOK: F==A is true\n",0x12);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: copy constructor: Galois::Element CopyofD(D)\n",
                 0x36);
      iVar3 = local_388.m_value;
      pFVar5 = local_388.m_gf;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"RESULT: CopyofD = ",0x12);
      std::ostream::operator<<((ostream *)&std::cout,iVar3);
      iVar4 = local_388.m_value;
      iVar1 = pFVar5->q;
      iVar2 = (local_388.m_gf)->q;
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"ERROR: CopyofD==D is false","");
      Assert(iVar3 == iVar4 && iVar1 == iVar2,&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nOK: CopyofD==D is true\n",0x18);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: F = C - D\n",0x13);
      Galois::Element::Element
                (&local_3e8,local_368.m_gf,
                 ((local_368.m_gf)->plus).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_368.m_gf)->plus).m_sizeX *
                  (long)((local_368.m_gf)->neg).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start[local_388.m_value] +
                  (long)local_368.m_value]);
      local_3c8.m_gf = local_3e8.m_gf;
      local_3c8.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: F = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_3c8.m_value);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: E = D + F\n",0x13);
      Galois::Element::Element
                (&local_3e8,local_388.m_gf,
                 ((local_388.m_gf)->plus).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_388.m_gf)->plus).m_sizeX * (long)local_3c8.m_value +
                  (long)local_388.m_value]);
      local_3d8.m_gf = local_3e8.m_gf;
      local_3d8.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: E = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_3d8.m_value);
      iVar4 = local_368.m_value;
      iVar3 = local_3d8.m_value;
      iVar1 = (local_368.m_gf)->q;
      iVar2 = (local_3d8.m_gf)->q;
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_178,"ERROR: C==E is false","");
      Assert(iVar4 == iVar3 && iVar1 == iVar2,&local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nOK: C==E is true\n",0x12);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: F = A * B\n",0x13);
      Galois::Element::Element
                (&local_3e8,local_3b8.m_gf,
                 ((local_3b8.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_3b8.m_gf)->times).m_sizeX * (long)local_398.m_value +
                  (long)local_3b8.m_value]);
      local_3c8.m_gf = local_3e8.m_gf;
      local_3c8.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: F = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_3c8.m_value);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: E = F / A\n",0x13);
      Galois::Element::operator/(&local_3e8,&local_3c8);
      local_3d8.m_gf = local_3e8.m_gf;
      local_3d8.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: E = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_3d8.m_value);
      iVar4 = local_398.m_value;
      iVar3 = local_3d8.m_value;
      iVar1 = (local_398.m_gf)->q;
      iVar2 = (local_3d8.m_gf)->q;
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_198,"ERROR: B==E is false","");
      Assert(iVar4 == iVar3 && iVar1 == iVar2,&local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nOK: B==E is true\n",0x12);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: F = A / B\n",0x13);
      Galois::Element::operator/(&local_3e8,&local_3b8);
      local_3c8.m_gf = local_3e8.m_gf;
      local_3c8.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: F = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_3c8.m_value);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: E = F * B\n",0x13);
      Galois::Element::Element
                (&local_3e8,local_3c8.m_gf,
                 ((local_3c8.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_3c8.m_gf)->times).m_sizeX * (long)local_398.m_value +
                  (long)local_3c8.m_value]);
      local_3d8.m_gf = local_3e8.m_gf;
      local_3d8.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: E = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_3d8.m_value);
      iVar4 = local_3b8.m_value;
      iVar3 = local_3d8.m_value;
      iVar1 = (local_3b8.m_gf)->q;
      iVar2 = (local_3d8.m_gf)->q;
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b8,"ERROR: A==E is false","");
      Assert(iVar4 == iVar3 && iVar1 == iVar2,&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nOK: A==E is true\n",0x12);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: E = a * B\n",0x13);
      Galois::Element::Element(&local_118,local_398.m_gf,2);
      Galois::Element::Element
                (&local_3e8,local_118.m_gf,
                 ((local_118.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_118.m_gf)->times).m_sizeX * (long)local_398.m_value +
                  (long)local_118.m_value]);
      local_3d8.m_gf = local_3e8.m_gf;
      local_3d8.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: E = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_3d8.m_value);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: F = A * b\n",0x13);
      Galois::Element::operator*(&local_3e8,(int)&local_3b8);
      local_3c8.m_gf = local_3e8.m_gf;
      local_3c8.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: F = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_3c8.m_value);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: G = E + F\n",0x13);
      Galois::Element::Element
                (&local_3e8,local_3d8.m_gf,
                 ((local_3d8.m_gf)->plus).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_3d8.m_gf)->plus).m_sizeX * (long)local_3c8.m_value +
                  (long)local_3d8.m_value]);
      local_378.m_gf = local_3e8.m_gf;
      local_378.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: G = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_378.m_value);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: E = B * a\n",0x13);
      Galois::Element::operator*(&local_3e8,(int)&local_398);
      local_3d8.m_gf = local_3e8.m_gf;
      local_3d8.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: E = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_3d8.m_value);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: F = b * A\n",0x13);
      Galois::Element::Element(&local_108,local_3b8.m_gf,3);
      Galois::Element::Element
                (&local_3e8,local_108.m_gf,
                 ((local_108.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_108.m_gf)->times).m_sizeX * (long)local_3b8.m_value +
                  (long)local_108.m_value]);
      local_3c8.m_gf = local_3e8.m_gf;
      local_3c8.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: F = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_3c8.m_value);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: H = F + E\n",0x13);
      Galois::Element::Element
                (&local_3e8,local_3c8.m_gf,
                 ((local_3c8.m_gf)->plus).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_3c8.m_gf)->plus).m_sizeX * (long)local_3d8.m_value +
                  (long)local_3c8.m_value]);
      local_348.m_gf = local_3e8.m_gf;
      local_348.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: G = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_378.m_value);
      iVar4 = local_348.m_value;
      iVar3 = local_378.m_value;
      iVar1 = (local_378.m_gf)->q;
      iVar2 = (local_348.m_gf)->q;
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1d8,"ERROR: G==H is false","");
      Assert(iVar3 == iVar4 && iVar1 == iVar2,&local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nOK: G==H is true\n",0x12);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: G = A * B + C * D\n",0x1b);
      Galois::Element::Element
                (&local_3a8,local_3b8.m_gf,
                 ((local_3b8.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_3b8.m_gf)->times).m_sizeX * (long)local_398.m_value +
                  (long)local_3b8.m_value]);
      Galois::Element::Element
                (&local_358,local_368.m_gf,
                 ((local_368.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_368.m_gf)->times).m_sizeX * (long)local_388.m_value +
                  (long)local_368.m_value]);
      Galois::Element::Element
                (&local_3e8,local_3a8.m_gf,
                 ((local_3a8.m_gf)->plus).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_3a8.m_gf)->plus).m_sizeX * (long)local_358.m_value +
                  (long)local_3a8.m_value]);
      local_378.m_gf = local_3e8.m_gf;
      local_378.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: G = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_378.m_value);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: H = D * C + B * A\n",0x1b);
      Galois::Element::Element
                (&local_3a8,local_388.m_gf,
                 ((local_388.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_388.m_gf)->times).m_sizeX * (long)local_368.m_value +
                  (long)local_388.m_value]);
      Galois::Element::Element
                (&local_358,local_398.m_gf,
                 ((local_398.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_398.m_gf)->times).m_sizeX * (long)local_3b8.m_value +
                  (long)local_398.m_value]);
      Galois::Element::Element
                (&local_3e8,local_3a8.m_gf,
                 ((local_3a8.m_gf)->plus).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_3a8.m_gf)->plus).m_sizeX * (long)local_358.m_value +
                  (long)local_3a8.m_value]);
      local_348.m_gf = local_3e8.m_gf;
      local_348.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: H = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_348.m_value);
      iVar4 = local_348.m_value;
      iVar3 = local_378.m_value;
      iVar1 = (local_378.m_gf)->q;
      iVar2 = (local_348.m_gf)->q;
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f8,"ERROR: G==H is false","");
      Assert(iVar3 == iVar4 && iVar1 == iVar2,&local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nOK: G==H is true\n",0x12);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: G = A * B * C * D\n",0x1b);
      Galois::Element::Element
                (&local_358,local_3b8.m_gf,
                 ((local_3b8.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_3b8.m_gf)->times).m_sizeX * (long)local_398.m_value +
                  (long)local_3b8.m_value]);
      Galois::Element::Element
                (&local_3a8,local_358.m_gf,
                 ((local_358.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_358.m_gf)->times).m_sizeX * (long)local_368.m_value +
                  (long)local_358.m_value]);
      Galois::Element::Element
                (&local_3e8,local_3a8.m_gf,
                 ((local_3a8.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_3a8.m_gf)->times).m_sizeX * (long)local_388.m_value +
                  (long)local_3a8.m_value]);
      local_378.m_gf = local_3e8.m_gf;
      local_378.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: G = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_378.m_value);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: G = G / A\n",0x13);
      Galois::Element::operator/(&local_358,&local_378);
      Galois::Element::operator/(&local_3a8,&local_358);
      Galois::Element::operator/(&local_3e8,&local_3a8);
      local_348.m_gf = local_3e8.m_gf;
      local_348.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: G = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_348.m_value);
      iVar4 = local_348.m_value;
      iVar3 = local_398.m_value;
      iVar1 = (local_398.m_gf)->q;
      iVar2 = (local_348.m_gf)->q;
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_218,"ERROR: B==H is false","");
      Assert(iVar3 == iVar4 && iVar1 == iVar2,&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nOK: B==H is true\n",0x12);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: G = A * B * C * D * A * B * D * C\n",0x2b);
      Galois::Element::Element
                (&local_328,local_3b8.m_gf,
                 ((local_3b8.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_3b8.m_gf)->times).m_sizeX * (long)local_398.m_value +
                  (long)local_3b8.m_value]);
      Galois::Element::Element
                (&local_318,local_328.m_gf,
                 ((local_328.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_328.m_gf)->times).m_sizeX * (long)local_368.m_value +
                  (long)local_328.m_value]);
      Galois::Element::Element
                (&local_308,local_318.m_gf,
                 ((local_318.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_318.m_gf)->times).m_sizeX * (long)local_388.m_value +
                  (long)local_318.m_value]);
      Galois::Element::Element
                (&local_338,local_308.m_gf,
                 ((local_308.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_308.m_gf)->times).m_sizeX * (long)local_3b8.m_value +
                  (long)local_308.m_value]);
      Galois::Element::Element
                (&local_358,local_338.m_gf,
                 ((local_338.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_338.m_gf)->times).m_sizeX * (long)local_398.m_value +
                  (long)local_338.m_value]);
      Galois::Element::Element
                (&local_3a8,local_358.m_gf,
                 ((local_358.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_358.m_gf)->times).m_sizeX * (long)local_388.m_value +
                  (long)local_358.m_value]);
      Galois::Element::Element
                (&local_3e8,local_3a8.m_gf,
                 ((local_3a8.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_3a8.m_gf)->times).m_sizeX * (long)local_368.m_value +
                  (long)local_3a8.m_value]);
      local_378.m_gf = local_3e8.m_gf;
      local_378.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: G = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_378.m_value);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: H = A * A * C * C * B * B * D * D\n",0x2b);
      Galois::Element::Element
                (&local_328,local_3b8.m_gf,
                 ((local_3b8.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(((local_3b8.m_gf)->times).m_sizeX + 1) * local_3b8.m_value]);
      Galois::Element::Element
                (&local_318,local_328.m_gf,
                 ((local_328.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_328.m_gf)->times).m_sizeX * (long)local_368.m_value +
                  (long)local_328.m_value]);
      Galois::Element::Element
                (&local_308,local_318.m_gf,
                 ((local_318.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_318.m_gf)->times).m_sizeX * (long)local_368.m_value +
                  (long)local_318.m_value]);
      Galois::Element::Element
                (&local_338,local_308.m_gf,
                 ((local_308.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_308.m_gf)->times).m_sizeX * (long)local_398.m_value +
                  (long)local_308.m_value]);
      Galois::Element::Element
                (&local_358,local_338.m_gf,
                 ((local_338.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_338.m_gf)->times).m_sizeX * (long)local_398.m_value +
                  (long)local_338.m_value]);
      Galois::Element::Element
                (&local_3a8,local_358.m_gf,
                 ((local_358.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_358.m_gf)->times).m_sizeX * (long)local_388.m_value +
                  (long)local_358.m_value]);
      Galois::Element::Element
                (&local_3e8,local_3a8.m_gf,
                 ((local_3a8.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_3a8.m_gf)->times).m_sizeX * (long)local_388.m_value +
                  (long)local_3a8.m_value]);
      local_348.m_gf = local_3e8.m_gf;
      local_348.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: H = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_348.m_value);
      iVar4 = local_348.m_value;
      iVar3 = local_378.m_value;
      iVar1 = (local_378.m_gf)->q;
      iVar2 = (local_348.m_gf)->q;
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_238,"ERROR: G==H is false","");
      Assert(iVar3 == iVar4 && iVar1 == iVar2,&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nOK: G==H is true\n",0x12);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: E = (A + B) * C\n",0x19);
      Galois::Element::Element
                (&local_3a8,local_3b8.m_gf,
                 ((local_3b8.m_gf)->plus).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_3b8.m_gf)->plus).m_sizeX * (long)local_398.m_value +
                  (long)local_3b8.m_value]);
      Galois::Element::Element
                (&local_3e8,local_3a8.m_gf,
                 ((local_3a8.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_3a8.m_gf)->times).m_sizeX * (long)local_368.m_value +
                  (long)local_3a8.m_value]);
      local_3d8.m_gf = local_3e8.m_gf;
      local_3d8.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: E = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_3d8.m_value);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: F = A * C + B * C\n",0x1b);
      Galois::Element::Element
                (&local_3a8,local_3b8.m_gf,
                 ((local_3b8.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_3b8.m_gf)->times).m_sizeX * (long)local_368.m_value +
                  (long)local_3b8.m_value]);
      Galois::Element::Element
                (&local_358,local_398.m_gf,
                 ((local_398.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_398.m_gf)->times).m_sizeX * (long)local_368.m_value +
                  (long)local_398.m_value]);
      Galois::Element::Element
                (&local_3e8,local_3a8.m_gf,
                 ((local_3a8.m_gf)->plus).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_3a8.m_gf)->plus).m_sizeX * (long)local_358.m_value +
                  (long)local_3a8.m_value]);
      local_3c8.m_gf = local_3e8.m_gf;
      local_3c8.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: F = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_3c8.m_value);
      iVar4 = local_3c8.m_value;
      iVar3 = local_3d8.m_value;
      iVar1 = (local_3d8.m_gf)->q;
      iVar2 = (local_3c8.m_gf)->q;
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_258,"ERROR: E==F is false","");
      Assert(iVar3 == iVar4 && iVar1 == iVar2,&local_258);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nOK: E==F is true\n",0x12);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: E = (A + C) * (B + D)\n",0x1f);
      Galois::Element::Element
                (&local_3a8,local_3b8.m_gf,
                 ((local_3b8.m_gf)->plus).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_3b8.m_gf)->plus).m_sizeX * (long)local_368.m_value +
                  (long)local_3b8.m_value]);
      Galois::Element::Element
                (&local_358,local_398.m_gf,
                 ((local_398.m_gf)->plus).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_398.m_gf)->plus).m_sizeX * (long)local_388.m_value +
                  (long)local_398.m_value]);
      Galois::Element::Element
                (&local_3e8,local_3a8.m_gf,
                 ((local_3a8.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_3a8.m_gf)->times).m_sizeX * (long)local_358.m_value +
                  (long)local_3a8.m_value]);
      local_3d8.m_gf = local_3e8.m_gf;
      local_3d8.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: E = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_3d8.m_value);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: F = B * A + D * A + C * B + D * C\n",0x2b);
      Galois::Element::Element
                (&local_338,local_398.m_gf,
                 ((local_398.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_398.m_gf)->times).m_sizeX * (long)local_3b8.m_value +
                  (long)local_398.m_value]);
      Galois::Element::Element
                (&local_308,local_388.m_gf,
                 ((local_388.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_388.m_gf)->times).m_sizeX * (long)local_3b8.m_value +
                  (long)local_388.m_value]);
      Galois::Element::Element
                (&local_358,local_338.m_gf,
                 ((local_338.m_gf)->plus).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_338.m_gf)->plus).m_sizeX * (long)local_308.m_value +
                  (long)local_338.m_value]);
      Galois::Element::Element
                (&local_318,local_368.m_gf,
                 ((local_368.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_368.m_gf)->times).m_sizeX * (long)local_398.m_value +
                  (long)local_368.m_value]);
      Galois::Element::Element
                (&local_3a8,local_358.m_gf,
                 ((local_358.m_gf)->plus).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_358.m_gf)->plus).m_sizeX * (long)local_318.m_value +
                  (long)local_358.m_value]);
      Galois::Element::Element
                (&local_328,local_388.m_gf,
                 ((local_388.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_388.m_gf)->times).m_sizeX * (long)local_368.m_value +
                  (long)local_388.m_value]);
      Galois::Element::Element
                (&local_3e8,local_3a8.m_gf,
                 ((local_3a8.m_gf)->plus).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_3a8.m_gf)->plus).m_sizeX * (long)local_328.m_value +
                  (long)local_3a8.m_value]);
      local_3c8.m_gf = local_3e8.m_gf;
      local_3c8.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: F = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_3c8.m_value);
      iVar4 = local_3c8.m_value;
      iVar3 = local_3d8.m_value;
      iVar1 = (local_3d8.m_gf)->q;
      iVar2 = (local_3c8.m_gf)->q;
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_278,"ERROR: E==F is false","");
      Assert(iVar3 == iVar4 && iVar1 == iVar2,&local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nOK: E==F is true\n",0x12);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: E = (A + C) / (B + D)\n",0x1f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"A + C = ",8);
      Galois::Element::Element
                (&local_3e8,local_3b8.m_gf,
                 ((local_3b8.m_gf)->plus).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_3b8.m_gf)->plus).m_sizeX * (long)local_368.m_value +
                  (long)local_3b8.m_value]);
      std::ostream::operator<<((ostream *)&std::cout,local_3e8.m_value);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"B + D = ",8);
      Galois::Element::Element
                (&local_3e8,local_398.m_gf,
                 ((local_398.m_gf)->plus).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_398.m_gf)->plus).m_sizeX * (long)local_388.m_value +
                  (long)local_398.m_value]);
      std::ostream::operator<<((ostream *)&std::cout,local_3e8.m_value);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
      Galois::Element::Element
                (&local_3a8,local_3b8.m_gf,
                 ((local_3b8.m_gf)->plus).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_3b8.m_gf)->plus).m_sizeX * (long)local_368.m_value +
                  (long)local_3b8.m_value]);
      Galois::Element::Element
                (&local_358,local_398.m_gf,
                 ((local_398.m_gf)->plus).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_398.m_gf)->plus).m_sizeX * (long)local_388.m_value +
                  (long)local_398.m_value]);
      Galois::Element::operator/(&local_3e8,&local_3a8);
      local_3d8.m_gf = local_3e8.m_gf;
      local_3d8.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: E = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_3d8.m_value);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: F = (D + B) / (C + A)\n",0x1f);
      Galois::Element::Element
                (&local_3a8,local_388.m_gf,
                 ((local_388.m_gf)->plus).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_388.m_gf)->plus).m_sizeX * (long)local_398.m_value +
                  (long)local_388.m_value]);
      Galois::Element::Element
                (&local_358,local_368.m_gf,
                 ((local_368.m_gf)->plus).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_368.m_gf)->plus).m_sizeX * (long)local_3b8.m_value +
                  (long)local_368.m_value]);
      Galois::Element::operator/(&local_3e8,&local_3a8);
      local_3c8.m_gf = local_3e8.m_gf;
      local_3c8.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: F = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_3c8.m_value);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: G = E * F\n",0x13);
      Galois::Element::Element
                (&local_3e8,local_3d8.m_gf,
                 ((local_3d8.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_3d8.m_gf)->times).m_sizeX * (long)local_3c8.m_value +
                  (long)local_3d8.m_value]);
      local_378.m_gf = local_3e8.m_gf;
      local_378.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: G = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_378.m_value);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: E = 2*A + C*D\n",0x17);
      Galois::Element::Element(&local_2f8,local_3b8.m_gf,2);
      Galois::Element::Element
                (&local_3a8,local_2f8.m_gf,
                 ((local_2f8.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_2f8.m_gf)->times).m_sizeX * (long)local_3b8.m_value +
                  (long)local_2f8.m_value]);
      Galois::Element::Element
                (&local_2f8,local_368.m_gf,
                 ((local_368.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_368.m_gf)->times).m_sizeX * (long)local_388.m_value +
                  (long)local_368.m_value]);
      Galois::Element::Element
                (&local_3e8,local_3a8.m_gf,
                 ((local_3a8.m_gf)->plus).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_3a8.m_gf)->plus).m_sizeX * (long)local_2f8.m_value +
                  (long)local_3a8.m_value]);
      local_3d8.m_gf = local_3e8.m_gf;
      local_3d8.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: E = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_3d8.m_value);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: F = B*B - 5*D\n",0x17);
      Galois::Element::Element
                (&local_3e8,local_398.m_gf,
                 ((local_398.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(((local_398.m_gf)->times).m_sizeX + 1) * local_398.m_value]);
      Galois::Element::Element(&local_2e8,local_388.m_gf,5);
      Galois::Element::Element
                (&local_3a8,local_2e8.m_gf,
                 ((local_2e8.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_2e8.m_gf)->times).m_sizeX * (long)local_388.m_value +
                  (long)local_2e8.m_value]);
      Galois::Element::Element
                (&local_2f8,local_3e8.m_gf,
                 ((local_3e8.m_gf)->plus).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_3e8.m_gf)->plus).m_sizeX *
                  (long)((local_3e8.m_gf)->neg).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start[local_3a8.m_value] +
                  (long)local_3e8.m_value]);
      local_3c8.m_gf = local_2f8.m_gf;
      local_3c8.m_value = local_2f8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: F = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_3c8.m_value);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: G = E / F\n",0x13);
      Galois::Element::operator/(&local_2e8,&local_3d8);
      local_378.m_gf = local_2e8.m_gf;
      local_378.m_value = local_2e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: G = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_378.m_value);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: F = ((-D)*5 + B*B) / (D*C + A*2)\n",0x2a);
      Galois::Element::Element
                (&local_338,local_388.m_gf,
                 ((local_388.m_gf)->neg).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[local_388.m_value]);
      Galois::Element::operator*(&local_358,(int)&local_338);
      Galois::Element::Element
                (&local_308,local_398.m_gf,
                 ((local_398.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(((local_398.m_gf)->times).m_sizeX + 1) * local_398.m_value]);
      Galois::Element::Element
                (&local_3a8,local_358.m_gf,
                 ((local_358.m_gf)->plus).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_358.m_gf)->plus).m_sizeX * (long)local_308.m_value +
                  (long)local_358.m_value]);
      Galois::Element::Element
                (&local_328,local_388.m_gf,
                 ((local_388.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_388.m_gf)->times).m_sizeX * (long)local_368.m_value +
                  (long)local_388.m_value]);
      Galois::Element::operator*(&local_f8,(int)&local_3b8);
      Galois::Element::Element
                (&local_318,local_328.m_gf,
                 ((local_328.m_gf)->plus).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_328.m_gf)->plus).m_sizeX * (long)local_f8.m_value +
                  (long)local_328.m_value]);
      Galois::Element::operator/(&local_3e8,&local_3a8);
      local_3c8.m_gf = local_3e8.m_gf;
      local_3c8.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: F = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_3c8.m_value);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: G = E * F\n",0x13);
      Galois::Element::Element
                (&local_3e8,local_3d8.m_gf,
                 ((local_3d8.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(long)((local_3d8.m_gf)->times).m_sizeX * (long)local_3c8.m_value +
                  (long)local_3d8.m_value]);
      local_378.m_gf = local_3e8.m_gf;
      local_378.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: G = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_378.m_value);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: E = A / A\n",0x13);
      Galois::Element::operator/(&local_3e8,&local_3b8);
      local_3d8.m_gf = local_3e8.m_gf;
      local_3d8.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: E = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_3d8.m_value);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: E = sqrt(A)\n",0x15);
      Galois::Element::Element
                (&local_3e8,local_3b8.m_gf,
                 ((local_3b8.m_gf)->root).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[local_3b8.m_value]);
      local_3d8.m_gf = local_3e8.m_gf;
      local_3d8.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: E = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_3d8.m_value);
      iVar1 = local_3d8.m_value;
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2d8,"ERROR: A has no root","");
      Assert((bool)((byte)~(byte)((uint)iVar1 >> 0x18) >> 7),&local_2d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nACTION: F = E * E\n",0x13);
      Galois::Element::Element
                (&local_3e8,local_3d8.m_gf,
                 ((local_3d8.m_gf)->times).m_data.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start
                 [(((local_3d8.m_gf)->times).m_sizeX + 1) * local_3d8.m_value]);
      local_3c8.m_gf = local_3e8.m_gf;
      local_3c8.m_value = local_3e8.m_value;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RESULT: F = ",0xc);
      std::ostream::operator<<((ostream *)&std::cout,local_3c8.m_value);
      iVar4 = local_3b8.m_value;
      iVar3 = local_3c8.m_value;
      iVar1 = (local_3b8.m_gf)->q;
      iVar2 = (local_3c8.m_gf)->q;
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_298,"ERROR: A==F is false","");
      Assert(iVar4 == iVar3 && iVar1 == iVar2,&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nOK: A==F is true\n",0x12);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\n---------------------------------------------------\n",
                 0x35);
      if (local_e8.poly.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.poly.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_e8.times.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.times.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_e8.plus.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.plus.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_e8.root.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.root.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_e8.neg.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_e8.neg.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((void *)CONCAT44(local_e8.inv.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           local_e8.inv.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_e8.inv.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         local_e8.inv.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start._0_4_));
      }
      uVar7 = local_2b8 + 1;
    } while (uVar7 < (ulong)((long)local_2b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)local_2b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 2));
  }
  puts("passed");
  if (local_2b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void testGFMath()
{
    printf("\tTesting Galois field arithmetic...\n");
    vector<int> gfs = {9, 11, 13, 16, 49};

    for (size_t i = 0; i < gfs.size(); ++i)
    {
        // Define Galois Galois::Field
        Galois::Field gf(gfs[i]);
        cout << "Testing GF(" << gfs[i] << ")" << endl;
        //---------------------------------

        Galois::Element E(&gf), F(&gf), G(&gf), H(&gf);

        int a = 2, b = 3;
        // cout << "a=" << a << "  b=" << b << endl;

        Galois::Element A(&gf, 1);
        Galois::Element B(&gf, 2);
        Galois::Element C(&gf, 3);
        Galois::Element D(&gf, 6);

        cout << "A: " << A << endl;
        cout << "B: " << B << endl;
        cout << "C: " << C << endl;
        cout << "D: " << D << endl;

        //*********************** action begins ************************

        try
        {
            cout << "\nACTION: E = A + B\n";
            E = A + B;
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        //-------------------------------------------------------------
        cout << "\nACTION: E = -A\n";
        E = -A;
        cout << "RESULT: E = " << E;

        cout << "\nACTION: F = -E\n";
        F = -E;
        cout << "RESULT: F = " << F;

        Assert(F == A, "ERROR: F==A is false");
        cout << "\nOK: F==A is true\n";

        //-------------------------------------------------------------
        cout << "\nACTION: copy constructor: Galois::Element CopyofD(D)\n";
        Galois::Element CopyofD(D);
        cout << "RESULT: CopyofD = " << CopyofD;

        Assert(CopyofD == D, "ERROR: CopyofD==D is false");
        cout << "\nOK: CopyofD==D is true\n";

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: F = C - D\n";
            F = C - D;
            cout << "RESULT: F = " << F;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: E = D + F\n";
            E = D + F;
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(C == E, "ERROR: C==E is false");
        cout << "\nOK: C==E is true\n";

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: F = A * B\n";
            F = A * B;
            cout << "RESULT: F = " << F;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: E = F / A\n";
            E = F / A;
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(B == E, "ERROR: B==E is false");
        cout << "\nOK: B==E is true\n";

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: F = A / B\n";
            F = A / B;
            cout << "RESULT: F = " << F;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: E = F * B\n";
            E = F * B;
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(A == E, "ERROR: A==E is false");
        cout << "\nOK: A==E is true\n";

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: E = a * B\n";
            E = a * B;
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: F = A * b\n";
            F = A * b;
            cout << "RESULT: F = " << F;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: G = E + F\n";
            G = E + F;
            cout << "RESULT: G = " << G;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: E = B * a\n";
            E = B * a;
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: F = b * A\n";
            F = b * A;
            cout << "RESULT: F = " << F;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: H = F + E\n";
            H = F + E;
            cout << "RESULT: G = " << G;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(G == H, "ERROR: G==H is false");
        cout << "\nOK: G==H is true\n";

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: G = A * B + C * D\n";
            G = A * B + C * D;
            cout << "RESULT: G = " << G;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: H = D * C + B * A\n";
            H = D * C + B * A;
            cout << "RESULT: H = " << H;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(G == H, "ERROR: G==H is false");
        cout << "\nOK: G==H is true\n";

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: G = A * B * C * D\n";
            G = A * B * C * D;
            cout << "RESULT: G = " << G;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: G = G / A\n";
            H = (((G / A) / D) / C);
            cout << "RESULT: G = " << H;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(B == H, "ERROR: B==H is false");
        cout << "\nOK: B==H is true\n";

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: G = A * B * C * D * A * B * D * C\n";
            G = A * B * C * D * A * B * D * C;
            cout << "RESULT: G = " << G;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: H = A * A * C * C * B * B * D * D\n";
            H = A * A * C * C * B * B * D * D;
            cout << "RESULT: H = " << H;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(G == H, "ERROR: G==H is false");
        cout << "\nOK: G==H is true\n";

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: E = (A + B) * C\n";
            E = (A + B) * C;
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: F = A * C + B * C\n";
            F = A * C + B * C;
            cout << "RESULT: F = " << F;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(E == F, "ERROR: E==F is false");
        cout << "\nOK: E==F is true\n";

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: E = (A + C) * (B + D)\n";
            E = (A + C) * (B + D);
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: F = B * A + D * A + C * B + D * C\n";
            F = B * A + D * A + C * B + D * C;
            cout << "RESULT: F = " << F;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(E == F, "ERROR: E==F is false");
        cout << "\nOK: E==F is true\n";

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: E = (A + C) / (B + D)\n";
            cout << "A + C = " << (A + C) << endl;
            cout << "B + D = " << (B + D) << endl;
            E = (A + C) / (B + D);
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: F = (D + B) / (C + A)\n";
            F = (D + B) / (C + A);
            cout << "RESULT: F = " << F;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: G = E * F\n";
            G = E * F;
            cout << "RESULT: G = " << G;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: E = 2*A + C*D\n";
            E = 2 * A + C * D;
            cout << "RESULT: E = " << E;
            cout << "\nACTION: F = B*B - 5*D\n";
            F = B * B - 5 * D;
            cout << "RESULT: F = " << F;
            cout << "\nACTION: G = E / F\n";
            G = E / F;
            cout << "RESULT: G = " << G;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: F = ((-D)*5 + B*B) / (D*C + A*2)\n";
            F = ((-D) * 5 + B * B) / (D * C + A * 2);
            cout << "RESULT: F = " << F;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: G = E * F\n";
            G = E * F;
            cout << "RESULT: G = " << G;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: E = A / A\n";
            E = A / A;
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: E = sqrt(A)\n";
            E = A.sqrt();
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(E.value() >= 0, "ERROR: A has no root");

        try
        {
            cout << "\nACTION: F = E * E\n";
            F = E * E;
            cout << "RESULT: F = " << F;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(A == F, "ERROR: A==F is false");
        cout << "\nOK: A==F is true\n";

        cout << "\n---------------------------------------------------\n";
    }
    printf("passed\n");
}